

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O3

array_n<bool,_2,_std::allocator<bool>_> * __thiscall
sisl::array_n<bool,_2,_std::allocator<bool>_>::operator=
          (array_n<bool,_2,_std::allocator<bool>_> *this,
          array_n<bool,_2,_std::allocator<bool>_> *obj)

{
  undefined8 uVar1;
  pointer pbVar2;
  pointer pbVar3;
  bool *pbVar4;
  undefined8 uVar5;
  uint uVar6;
  pointer __s;
  pointer unaff_R13;
  size_t __n;
  
  uVar5 = *(undefined8 *)obj->_dims;
  uVar6 = obj->_dims[1] * obj->_dims[0];
  if (uVar6 == 0) {
    __n = 0;
    __s = (pointer)0x0;
  }
  else {
    __n = (size_t)uVar6;
    __s = (pointer)operator_new(__n);
    memset(__s,0,__n);
    unaff_R13 = __s + __n;
  }
  memcpy(__s,obj->_array,__n);
  uVar1 = *(undefined8 *)this->_dims;
  *(undefined8 *)this->_dims = uVar5;
  pbVar2 = this->first;
  pbVar3 = this->last;
  this->first = __s;
  this->last = unaff_R13;
  pbVar4 = this->_array;
  this->_array = __s;
  if (((pbVar4 != (bool *)0x0) && (pbVar2 != pbVar3)) &&
     ((int)uVar1 * (int)((ulong)uVar1 >> 0x20) != 0)) {
    operator_delete(pbVar2);
  }
  return this;
}

Assistant:

array_n &operator=(const array_n &obj){
            array_n copy(obj);

            for(int i = 0; i < N; i++) {
                std::swap(_dims[i], copy._dims[i]);
            }
            std::swap(first, copy.first);
            std::swap(last, copy.last);
            std::swap(_array, copy._array);

            return *this;
        }